

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O1

void __thiscall
jsoncons::uri::uri(uri *this,string_view scheme,string_view userinfo,string_view host,
                  string_view port,string_view path,string_view query,string_view fragment)

{
  size_type sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  json_runtime_error<std::invalid_argument,_void> *pjVar4;
  system_error *this_00;
  size_t sVar5;
  type tVar6;
  error_code __ec;
  string local_70;
  string_view local_50;
  error_code local_40;
  
  sVar5 = scheme._M_len;
  local_50._M_str = userinfo._M_str;
  local_50._M_len = userinfo._M_len;
  (this->uri_string_)._M_dataplus._M_p = (pointer)&(this->uri_string_).field_2;
  (this->uri_string_)._M_string_length = 0;
  (this->uri_string_).field_2._M_local_buf[0] = '\0';
  (this->scheme_part_).first = 0;
  (this->scheme_part_).second = 0;
  (this->userinfo_part_).first = 0;
  (this->userinfo_part_).second = 0;
  (this->host_part_).first = 0;
  (this->host_part_).second = 0;
  (this->port_part_).first = 0;
  (this->port_part_).second = 0;
  (this->path_part_).first = 0;
  (this->path_part_).second = 0;
  (this->query_part_).first = 0;
  (this->query_part_).second = 0;
  (this->fragment_part_).first = 0;
  (this->fragment_part_).second = 0;
  if (sVar5 != 0) {
    std::__cxx11::string::append((char *)this,(ulong)scheme._M_str);
    (this->scheme_part_).second = (this->uri_string_)._M_string_length;
  }
  if (((local_50._M_len == 0) && (host._M_len == 0)) && (port._M_len == 0)) {
    uVar2 = (undefined4)(this->uri_string_)._M_string_length;
    uVar3 = *(undefined4 *)((long)&(this->uri_string_)._M_string_length + 4);
    *(undefined4 *)&(this->host_part_).first = uVar2;
    *(undefined4 *)((long)&(this->host_part_).first + 4) = uVar3;
    *(undefined4 *)&(this->host_part_).second = uVar2;
    *(undefined4 *)((long)&(this->host_part_).second + 4) = uVar3;
    *(undefined4 *)&(this->userinfo_part_).first = uVar2;
    *(undefined4 *)((long)&(this->userinfo_part_).first + 4) = uVar3;
    *(undefined4 *)&(this->userinfo_part_).second = uVar2;
    *(undefined4 *)((long)&(this->userinfo_part_).second + 4) = uVar3;
    *(undefined4 *)&(this->port_part_).second = uVar2;
    *(undefined4 *)((long)&(this->port_part_).second + 4) = uVar3;
    *(undefined4 *)&(this->port_part_).first = uVar2;
    *(undefined4 *)((long)&(this->port_part_).first + 4) = uVar3;
    if (sVar5 != 0) {
      if (((path._M_len == 0) && (query._M_len == 0)) && (fragment._M_len == 0)) {
        pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"uri error.","");
        json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_70);
        __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                    json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
      }
      std::__cxx11::string::append((char *)this);
    }
  }
  else {
    if (sVar5 != 0) {
      std::__cxx11::string::append((char *)this);
    }
    sVar1 = (this->uri_string_)._M_string_length;
    if (local_50._M_len == 0) {
      (this->userinfo_part_).second = sVar1;
      (this->userinfo_part_).first = sVar1;
    }
    else {
      (this->userinfo_part_).first = sVar1;
      encode_userinfo(&local_50,&this->uri_string_);
      (this->userinfo_part_).second = (this->uri_string_)._M_string_length;
      std::__cxx11::string::append((char *)this);
    }
    if (host._M_len == 0) {
      pjVar4 = (json_runtime_error<std::invalid_argument,_void> *)__cxa_allocate_exception(0x18);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"uri error.","");
      json_runtime_error<std::invalid_argument,_void>::json_runtime_error(pjVar4,&local_70);
      __cxa_throw(pjVar4,&json_runtime_error<std::invalid_argument,void>::typeinfo,
                  json_runtime_error<std::invalid_argument,_void>::~json_runtime_error);
    }
    (this->host_part_).first = (this->uri_string_)._M_string_length;
    std::__cxx11::string::append((char *)this,(ulong)host._M_str);
    sVar1 = (this->uri_string_)._M_string_length;
    (this->host_part_).second = sVar1;
    if (port._M_len == 0) {
      (this->port_part_).second = sVar1;
      (this->port_part_).first = sVar1;
    }
    else {
      tVar6 = detail::to_integer<unsigned_short,char>
                        (port._M_str,port._M_len,(unsigned_short *)&local_70);
      if (tVar6.ec != success) {
        this_00 = (system_error *)__cxa_allocate_exception(0x20);
        std::error_code::error_code<jsoncons::uri_errc,void>(&local_40,invalid_port);
        __ec._4_4_ = 0;
        __ec._M_value = local_40._M_value;
        __ec._M_cat = local_40._M_cat;
        std::system_error::system_error(this_00,__ec);
        __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
      }
      std::__cxx11::string::append((char *)this);
      (this->port_part_).first = (this->uri_string_)._M_string_length;
      std::__cxx11::string::append((char *)this,(ulong)port._M_str);
      (this->port_part_).second = (this->uri_string_)._M_string_length;
    }
  }
  sVar1 = (this->uri_string_)._M_string_length;
  if (path._M_len == 0) {
    (this->path_part_).second = sVar1;
    (this->path_part_).first = sVar1;
  }
  else {
    (this->path_part_).first = sVar1;
    if ((host._M_len != 0) && (*path._M_str != '/')) {
      std::__cxx11::string::push_back((char)this);
    }
    encode_path(&path,&this->uri_string_);
    (this->path_part_).second = (this->uri_string_)._M_string_length;
  }
  if (query._M_len == 0) {
    sVar1 = (this->uri_string_)._M_string_length;
    (this->query_part_).second = sVar1;
    (this->query_part_).first = sVar1;
  }
  else {
    std::__cxx11::string::append((char *)this);
    (this->query_part_).first = (this->uri_string_)._M_string_length;
    encode_illegal_characters(&query,&this->uri_string_);
    (this->query_part_).second = (this->uri_string_)._M_string_length;
  }
  if (fragment._M_len == 0) {
    sVar1 = (this->uri_string_)._M_string_length;
    (this->fragment_part_).second = sVar1;
    (this->fragment_part_).first = sVar1;
  }
  else {
    std::__cxx11::string::append((char *)this);
    (this->fragment_part_).first = (this->uri_string_)._M_string_length;
    encode_illegal_characters(&fragment,&this->uri_string_);
    (this->fragment_part_).second = (this->uri_string_)._M_string_length;
  }
  return;
}

Assistant:

uri(jsoncons::string_view scheme,
            jsoncons::string_view userinfo,
            jsoncons::string_view host,
            jsoncons::string_view port,
            jsoncons::string_view path,
            jsoncons::string_view query = "",
            jsoncons::string_view fragment = "")
        {
            if (!scheme.empty()) 
            {
                uri_string_.append(scheme.data(), scheme.size());
                scheme_part_.second = uri_string_.length();
            }
            if (!userinfo.empty() || !host.empty() || !port.empty()) 
            {
                if (!scheme.empty()) 
                {
                    uri_string_.append("://");
                }

                if (!userinfo.empty()) 
                {
                    userinfo_part_.first = uri_string_.length();
                    encode_userinfo(userinfo, uri_string_);
                    userinfo_part_.second = uri_string_.length();
                    uri_string_.append("@");
                }
                else
                {
                    userinfo_part_.first = userinfo_part_.second = uri_string_.length();
                }

                if (!host.empty()) 
                {
                    host_part_.first = uri_string_.length();
                    uri_string_.append(host.data(), host.size());
                    host_part_.second = uri_string_.length();
                } 
                else 
                {
                    JSONCONS_THROW(json_runtime_error<std::invalid_argument>("uri error."));
                }

                if (!port.empty()) 
                {
                    if (!validate_port(port))
                    {
                        JSONCONS_THROW(std::system_error(uri_errc::invalid_port));
                    }

                    uri_string_.append(":");
                    port_part_.first = uri_string_.length();
                    uri_string_.append(port.data(), port.size());
                    port_part_.second = uri_string_.length();
                }
                else
                {
                    port_part_.first = port_part_.second = uri_string_.length();
                }
            }
            else 
            {
                userinfo_part_.first = userinfo_part_.second = uri_string_.length();
                host_part_.first = host_part_.second = uri_string_.length();
                port_part_.first = port_part_.second = uri_string_.length();
                if (!scheme.empty())
                {
                    if (!path.empty() || !query.empty() || !fragment.empty()) 
                    {
                        uri_string_.append(":");
                    } 
                    else 
                    {
                        JSONCONS_THROW(json_runtime_error<std::invalid_argument>("uri error."));
                    }
                }
            }

            if (!path.empty()) 
            {
                // if the URI is not opaque and the path is not already prefixed
                // with a '/', add one.
                path_part_.first = uri_string_.length();
                if (!host.empty() && (path.front() != '/')) 
                {
                    uri_string_.push_back('/');
                }
                encode_path(path, uri_string_);
                path_part_.second = uri_string_.length();
            }
            else
            {
                path_part_.first = path_part_.second = uri_string_.length();
            }

            if (!query.empty()) 
            {
                uri_string_.append("?");
                query_part_.first = uri_string_.length();
                encode_illegal_characters(query, uri_string_);
                query_part_.second = uri_string_.length();
            }
            else
            {
                query_part_.first = query_part_.second = uri_string_.length();
            }

            if (!fragment.empty()) 
            {
                uri_string_.append("#");
                fragment_part_.first = uri_string_.length();
                encode_illegal_characters(fragment, uri_string_);
                fragment_part_.second = uri_string_.length();
            }
            else
            {
                fragment_part_.first = fragment_part_.second = uri_string_.length();
            }
        }